

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

Var Js::JavascriptArray::ProfiledNewInstance(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  uint32 uVar3;
  Var *values;
  undefined4 *puVar4;
  JavascriptFunction *this;
  FunctionInfo *pFVar5;
  ArrayCallSiteInfo *this_00;
  Var aValue;
  ScriptContext *pSVar6;
  JavascriptLibrary *pJVar7;
  double T1;
  uint32 uvalue;
  double value;
  int elementCount;
  Var firstArgument;
  JavascriptArray *pNew;
  ArrayCallSiteInfo *arrayInfo;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  n = _count_args(callInfo);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x455,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  ArgumentReader::ArgumentReader((ArgumentReader *)&arrayInfo,(CallInfo *)&function_local,values);
  bVar2 = VarIs<Js::JavascriptFunction,Js::RecyclableObject>(function);
  if (bVar2) {
    this = VarTo<Js::JavascriptFunction,Js::RecyclableObject>(function);
    pFVar5 = JavascriptFunction::GetFunctionInfo(this);
    if (pFVar5 == (FunctionInfo *)EntryInfo::NewInstance) goto LAB_010c360a;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar4 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                              ,0x458,
                              "(VarIs<JavascriptFunction>(function) && VarTo<JavascriptFunction>(function)->GetFunctionInfo() == &JavascriptArray::EntryInfo::NewInstance)"
                              ,
                              "VarIs<JavascriptFunction>(function) && VarTo<JavascriptFunction>(function)->GetFunctionInfo() == &JavascriptArray::EntryInfo::NewInstance"
                             );
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar4 = 0;
LAB_010c360a:
  if (((uint)function_local & 0xffffff) < 2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x459,"(callInfo.Count >= 2)","callInfo.Count >= 2");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  this_00 = (ArrayCallSiteInfo *)Arguments::operator[]((Arguments *)&arrayInfo,0);
  if (((uint)function_local & 0xffffff) == 2) {
    aValue = Arguments::operator[]((Arguments *)&arrayInfo,1);
    bVar2 = TaggedInt::Is(aValue);
    if (bVar2) {
      uVar3 = TaggedInt::ToInt32(aValue);
      if ((int)uVar3 < 0) {
        pSVar6 = RecyclableObject::GetScriptContext(function);
        JavascriptError::ThrowRangeError(pSVar6,-0x7ff5ec5b,(PCWSTR)0x0);
      }
      if ((this_00 == (ArrayCallSiteInfo *)0x0) ||
         (bVar2 = ArrayCallSiteInfo::IsNativeArray(this_00), !bVar2)) {
        pJVar7 = RecyclableObject::GetLibrary(function);
        firstArgument = JavascriptLibrary::CreateArray(pJVar7,uVar3);
      }
      else {
        bVar2 = ArrayCallSiteInfo::IsNativeIntArray(this_00);
        if (bVar2) {
          pJVar7 = RecyclableObject::GetLibrary(function);
          firstArgument = JavascriptLibrary::CreateNativeIntArray(pJVar7,uVar3);
        }
        else {
          pJVar7 = RecyclableObject::GetLibrary(function);
          firstArgument = JavascriptLibrary::CreateNativeFloatArray(pJVar7,uVar3);
        }
      }
    }
    else {
      bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(aValue);
      if (bVar2) {
        T1 = JavascriptNumber::GetValue(aValue);
        uVar3 = JavascriptConversion::ToUInt32(T1);
        if ((T1 != (double)uVar3) || (NAN(T1) || NAN((double)uVar3))) {
          pSVar6 = RecyclableObject::GetScriptContext(function);
          JavascriptError::ThrowRangeError(pSVar6,-0x7ff5ec5b,(PCWSTR)0x0);
        }
        if ((this_00 == (ArrayCallSiteInfo *)0x0) ||
           (bVar2 = ArrayCallSiteInfo::IsNativeArray(this_00), !bVar2)) {
          pJVar7 = RecyclableObject::GetLibrary(function);
          firstArgument = JavascriptLibrary::CreateArray(pJVar7,uVar3);
        }
        else {
          bVar2 = ArrayCallSiteInfo::IsNativeIntArray(this_00);
          if (bVar2) {
            pJVar7 = RecyclableObject::GetLibrary(function);
            firstArgument = JavascriptLibrary::CreateNativeIntArray(pJVar7,uVar3);
          }
          else {
            pJVar7 = RecyclableObject::GetLibrary(function);
            firstArgument = JavascriptLibrary::CreateNativeFloatArray(pJVar7,uVar3);
          }
        }
      }
      else {
        pJVar7 = RecyclableObject::GetLibrary(function);
        firstArgument = JavascriptLibrary::CreateArray(pJVar7,1);
        DirectSetItemAt<void*>((JavascriptArray *)firstArgument,0,aValue);
      }
    }
  }
  else {
    if ((this_00 == (ArrayCallSiteInfo *)0x0) ||
       (bVar2 = ArrayCallSiteInfo::IsNativeArray(this_00), !bVar2)) {
      pJVar7 = RecyclableObject::GetLibrary(function);
      firstArgument = JavascriptLibrary::CreateArray(pJVar7,((uint)function_local & 0xffffff) - 1);
    }
    else {
      bVar2 = ArrayCallSiteInfo::IsNativeIntArray(this_00);
      if (bVar2) {
        pJVar7 = RecyclableObject::GetLibrary(function);
        firstArgument =
             JavascriptLibrary::CreateNativeIntArray(pJVar7,((uint)function_local & 0xffffff) - 1);
      }
      else {
        pJVar7 = RecyclableObject::GetLibrary(function);
        firstArgument =
             JavascriptLibrary::CreateNativeFloatArray(pJVar7,((uint)function_local & 0xffffff) - 1)
        ;
      }
    }
    (**(code **)(*firstArgument + 0x3b0))
              (firstArgument,((uint)function_local & 0xffffff) - 1,0,args.super_Arguments.Info,
               this_00);
  }
  (**(code **)(*firstArgument + 0x3a0))();
  return firstArgument;
}

Assistant:

Var JavascriptArray::ProfiledNewInstance(RecyclableObject* function, CallInfo callInfo, ...)
    {
        JIT_HELPER_REENTRANT_HEADER(ScrArr_ProfiledNewInstance);
        ARGUMENTS(args, callInfo);

        Assert(VarIs<JavascriptFunction>(function) &&
               VarTo<JavascriptFunction>(function)->GetFunctionInfo() == &JavascriptArray::EntryInfo::NewInstance);
        Assert(callInfo.Count >= 2);

        ArrayCallSiteInfo *arrayInfo = (ArrayCallSiteInfo*)args[0];
        JavascriptArray* pNew = nullptr;

        if (callInfo.Count == 2)
        {
            // Exactly one argument, which is the array length if it's a uint32.
            Var firstArgument = args[1];
            int elementCount;
            if (TaggedInt::Is(firstArgument))
            {
                elementCount = TaggedInt::ToInt32(firstArgument);
                if (elementCount < 0)
                {
                    JavascriptError::ThrowRangeError(function->GetScriptContext(), JSERR_ArrayLengthConstructIncorrect);
                }
                if (arrayInfo && arrayInfo->IsNativeArray())
                {
                    if (arrayInfo->IsNativeIntArray())
                    {
                        pNew = function->GetLibrary()->CreateNativeIntArray(elementCount);
                    }
                    else
                    {
                        pNew = function->GetLibrary()->CreateNativeFloatArray(elementCount);
                    }
                }
                else
                {
                    pNew = function->GetLibrary()->CreateArray(elementCount);
                }
            }
            else if (JavascriptNumber::Is_NoTaggedIntCheck(firstArgument))
            {
                // Non-tagged-int number: make sure the double value is really a uint32.
                double value = JavascriptNumber::GetValue(firstArgument);
                uint32 uvalue = JavascriptConversion::ToUInt32(value);
                if (value != uvalue)
                {
                    JavascriptError::ThrowRangeError(function->GetScriptContext(), JSERR_ArrayLengthConstructIncorrect);
                }
                if (arrayInfo && arrayInfo->IsNativeArray())
                {
                    if (arrayInfo->IsNativeIntArray())
                    {
                        pNew = function->GetLibrary()->CreateNativeIntArray(uvalue);
                    }
                    else
                    {
                        pNew = function->GetLibrary()->CreateNativeFloatArray(uvalue);
                    }
                }
                else
                {
                    pNew = function->GetLibrary()->CreateArray(uvalue);
                }
            }
            else
            {
                //
                // First element is not int/double
                // create an array of length 1.
                // Set first element as the passed Var
                //

                pNew = function->GetLibrary()->CreateArray(1);
                pNew->DirectSetItemAt<Var>(0, firstArgument);
            }
        }
        else
        {
            // Called with a list of initial element values.
            // Create an array of the appropriate length and walk the list.

            if (arrayInfo && arrayInfo->IsNativeArray())
            {
                if (arrayInfo->IsNativeIntArray())
                {
                    pNew = function->GetLibrary()->CreateNativeIntArray(callInfo.Count - 1);
                }
                else
                {
                    pNew = function->GetLibrary()->CreateNativeFloatArray(callInfo.Count - 1);
                }
            }
            else
            {
                pNew = function->GetLibrary()->CreateArray(callInfo.Count - 1);
            }
            pNew->FillFromArgs(callInfo.Count - 1, 0, args.Values, arrayInfo);
        }

#ifdef VALIDATE_ARRAY
        pNew->ValidateArray();
#endif
        return pNew;
        JIT_HELPER_END(ScrArr_ProfiledNewInstance);
    }